

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

int32_t mipsdsp_mul_i16_i16(int16_t a,int16_t b,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  undefined2 in_register_00000032;
  uint uVar2;
  undefined6 in_register_0000003a;
  
  uVar2 = (int)CONCAT62(in_register_0000003a,a) * CONCAT22(in_register_00000032,b);
  if ((int)(short)uVar2 != uVar2) {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x20;
  }
  return uVar2 & 0xffff;
}

Assistant:

static inline int32_t mipsdsp_mul_i16_i16(int16_t a, int16_t b,
                                          CPUMIPSState *env)
{
    int32_t temp;

    temp = (int32_t)a * (int32_t)b;

    if ((temp > (int)0x7FFF) || (temp < (int)0xFFFF8000)) {
        set_DSPControl_overflow_flag(1, 21, env);
    }
    temp &= 0x0000FFFF;

    return temp;
}